

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestRunner.cpp
# Opt level: O3

void __thiscall
glcts::getBaseOptions
          (glcts *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,string mustpassDir,string *apiName,string *configName,string *screenRotation,
          int width,int height)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  size_type *psVar7;
  ulong uVar8;
  undefined4 in_register_0000008c;
  size_type __dnew;
  string case_list_option;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  ulong *local_288;
  long local_280;
  ulong local_278;
  long lStack_270;
  ulong *local_268;
  long local_260;
  ulong local_258;
  long lStack_250;
  long *local_248 [2];
  long local_238 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  value_type local_208;
  long *local_1e8 [2];
  long local_1d8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,args,
             (long)&(apiName->_M_dataplus)._M_p +
             (long)&(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl);
  local_248[0] = local_238;
  pcVar3 = (configName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_248,pcVar3,pcVar3 + configName->_M_string_length);
  pcVar3 = (screenRotation->_M_dataplus)._M_p;
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e8,pcVar3,pcVar3 + screenRotation->_M_string_length);
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  local_2a8._M_dataplus._M_p = (pointer)0x15;
  local_1a8[0]._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)local_1a8,(ulong)&local_2a8);
  local_1a8[0].field_2._M_allocated_capacity = local_2a8._M_dataplus._M_p;
  builtin_strncpy(local_1a8[0]._M_dataplus._M_p,"--deqp-caselist-file=",0x15);
  local_1a8[0]._M_string_length = (size_type)local_2a8._M_dataplus._M_p;
  local_1a8[0]._M_dataplus._M_p[(long)local_2a8._M_dataplus._M_p] = '\0';
  std::operator+(&local_1c8,local_1a8,&local_228);
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_248[0]);
  local_288 = &local_278;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_278 = *puVar6;
    lStack_270 = plVar4[3];
  }
  else {
    local_278 = *puVar6;
    local_288 = (ulong *)*plVar4;
  }
  local_280 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_288);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_258 = *puVar6;
    lStack_250 = plVar4[3];
    local_268 = &local_258;
  }
  else {
    local_258 = *puVar6;
    local_268 = (ulong *)*plVar4;
  }
  local_260 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_1e8[0]);
  paVar1 = &local_2a8.field_2;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_2a8.field_2._M_allocated_capacity = *psVar7;
    local_2a8.field_2._8_8_ = plVar4[3];
    local_2a8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2a8.field_2._M_allocated_capacity = *psVar7;
    local_2a8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_2a8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_208.field_2._M_allocated_capacity = *psVar7;
    local_208.field_2._8_8_ = plVar4[3];
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar7;
    local_208._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_208._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,local_278 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,
                    (ulong)(local_1a8[0].field_2._M_allocated_capacity + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  local_2a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"--deqp-screen-rotation=","")
  ;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2a8,*(ulong *)CONCAT44(in_register_0000008c,width));
  paVar2 = &local_1a8[0].field_2;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_1a8[0].field_2._0_8_ = *psVar7;
    local_1a8[0].field_2._8_8_ = plVar4[3];
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1a8[0].field_2._0_8_ = *psVar7;
    local_1a8[0]._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_1a8[0]._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--deqp-surface-width=","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,(int)mustpassDir._M_dataplus._M_p);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar8 = 0xf;
  if (local_268 != &local_258) {
    uVar8 = local_258;
  }
  if (uVar8 < (ulong)(local_280 + local_260)) {
    uVar8 = 0xf;
    if (local_288 != &local_278) {
      uVar8 = local_278;
    }
    if (uVar8 < (ulong)(local_280 + local_260)) goto LAB_0083f513;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_268);
  }
  else {
LAB_0083f513:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_288);
  }
  psVar7 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_2a8.field_2._M_allocated_capacity = *psVar7;
    local_2a8.field_2._8_8_ = puVar5[3];
    local_2a8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2a8.field_2._M_allocated_capacity = *psVar7;
    local_2a8._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_2a8._M_string_length = puVar5[1];
  *puVar5 = psVar7;
  puVar5[1] = 0;
  *(undefined1 *)psVar7 = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,local_278 + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--deqp-surface-height=","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,(int)mustpassDir._M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar8 = 0xf;
  if (local_268 != &local_258) {
    uVar8 = local_258;
  }
  if (uVar8 < (ulong)(local_280 + local_260)) {
    uVar8 = 0xf;
    if (local_288 != &local_278) {
      uVar8 = local_278;
    }
    if ((ulong)(local_280 + local_260) <= uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_268);
      goto LAB_0083f687;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_288);
LAB_0083f687:
  psVar7 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_2a8.field_2._M_allocated_capacity = *psVar7;
    local_2a8.field_2._8_8_ = puVar5[3];
    local_2a8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2a8.field_2._M_allocated_capacity = *psVar7;
    local_2a8._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_2a8._M_string_length = puVar5[1];
  *puVar5 = psVar7;
  puVar5[1] = 0;
  *(undefined1 *)psVar7 = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,local_278 + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"--deqp-watchdog=disable","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void getBaseOptions(std::vector<std::string>& args, const string mustpassDir, const string apiName,
						   const string configName, const string screenRotation, int width, int height)
{
	args.push_back(getCaseListFileOption(mustpassDir, apiName, configName));
	args.push_back(string("--deqp-screen-rotation=") + screenRotation);
	args.push_back(string("--deqp-surface-width=") + de::toString(width));
	args.push_back(string("--deqp-surface-height=") + de::toString(height));
	args.push_back("--deqp-watchdog=disable");
}